

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageFloat *image,char *name)

{
  bool bVar1;
  int iVar2;
  IOException *this_00;
  char cVar3;
  long i;
  long lVar4;
  int j;
  long lVar5;
  long lVar6;
  work_t wVar7;
  allocator local_271;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream out;
  undefined1 local_228 [24];
  int aiStack_210 [120];
  
  bVar1 = gutil::isMSBFirst();
  iVar2 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar2 != '\0') && ((image->depth | 2U) == 3)) {
    std::__cxx11::string::string((string *)&type,"Pf",(allocator *)&out);
    if (image->depth == 3) {
      std::__cxx11::string::assign((char *)&type);
    }
    wVar7 = Image<float,_gimage::PixelTraits<float>_>::maxValue(image);
    anon_unknown_11::writePNMHeader
              (name,type._M_dataplus._M_p,image->width,image->height,0,
               (float)(~-(uint)(0.0 < wVar7) & 0x3f800000 |
                      (uint)(1.0 / wVar7) & -(uint)(0.0 < wVar7)));
    std::ofstream::ofstream(&out);
    std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
    std::ofstream::open((char *)&out,(_Ios_Openmode)name);
    lVar6 = image->height;
    while ((0 < lVar6 && (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0))) {
      lVar6 = lVar6 + -1;
      for (lVar4 = 0; lVar4 < image->width; lVar4 = lVar4 + 1) {
        for (lVar5 = 0; lVar5 < image->depth; lVar5 = lVar5 + 1) {
          cVar3 = (char)local_228;
          if (bVar1) {
            std::streambuf::sputc(cVar3);
            std::streambuf::sputc(cVar3);
            std::streambuf::sputc(cVar3);
          }
          else {
            std::streambuf::sputc(cVar3);
            std::streambuf::sputc(cVar3);
            std::streambuf::sputc(cVar3);
          }
          std::streambuf::sputc(cVar3);
        }
      }
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    std::__cxx11::string::~string((string *)&type);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_250,name,&local_271);
  std::operator+(&type,"Can only save PNM images with depth 1 or 3 (",&local_250);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,&type,")"
                );
  gutil::IOException::IOException(this_00,(string *)&out);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNMImageIO::save(const ImageFloat &image, const char *name) const
{
  float p, s;
  char *c=reinterpret_cast<char *>(&p);
  bool msbfirst=gutil::isMSBFirst();

  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="Pf";

  if (image.getDepth() == 3)
  {
    type="PF";
  }

  s=image.maxValue();

  if (s > 0)
  {
    s=1/s;
  }
  else
  {
    s=1;
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 0, s);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=image.getHeight()-1; k>=0 && out.good(); k--)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          // we assume that the plattform uses IEEE 32 bit floating
          // point format, otherwise this will not work

          p=static_cast<float>(image.get(i, k, j));

          if (msbfirst)
          {
            sb->sputc(c[0]);
            sb->sputc(c[1]);
            sb->sputc(c[2]);
            sb->sputc(c[3]);
          }
          else
          {
            sb->sputc(c[3]);
            sb->sputc(c[2]);
            sb->sputc(c[1]);
            sb->sputc(c[0]);
          }
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}